

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::EmitAddtlInfo_SnapSetInfo(SnapObject *snpObject,FileWriter *writer)

{
  uint32 *puVar1;
  ulong uVar2;
  
  if (snpObject->SnapObjectTag != SnapSetObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  puVar1 = (uint32 *)snpObject->AddtlSnapObjectInfo;
  FileWriter::WriteLengthValue(writer,*puVar1,CommaAndBigSpaceSeparator);
  if (*puVar1 != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    if (*puVar1 != 0) {
      uVar2 = 0;
      do {
        NSSnapValues::EmitTTDVar
                  (*(TTDVar *)(*(long *)(puVar1 + 2) + uVar2 * 8),writer,
                   (uVar2 == 0) + CommaSeparator);
        uVar2 = uVar2 + 1;
      } while (uVar2 < *puVar1);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  return;
}

Assistant:

void EmitAddtlInfo_SnapSetInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapSetInfo* setInfo = SnapObjectGetAddtlInfoAs<SnapSetInfo*, SnapObjectType::SnapSetObject>(snpObject);

            writer->WriteLengthValue(setInfo->SetSize, NSTokens::Separator::CommaAndBigSpaceSeparator);

            if(setInfo->SetSize > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = 0; i < setInfo->SetSize; ++i)
                {
                    NSSnapValues::EmitTTDVar(setInfo->SetValueArray[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::BigSpaceSeparator);
                }
                writer->WriteSequenceEnd();
            }
        }